

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void quit_hook(char *s)

{
  int local_14;
  int j;
  char *s_local;
  
  for (local_14 = 7; -1 < local_14; local_14 = local_14 + -1) {
    if (angband_term[local_14] != (term *)0x0) {
      term_nuke(angband_term[local_14]);
    }
  }
  return;
}

Assistant:

static void quit_hook(const char *s)
{
	int j;

	/* Unused parameter */
	(void)s;

	/* Scan windows */
	for (j = ANGBAND_TERM_MAX - 1; j >= 0; j--) {
		/* Unused */
		if (!angband_term[j]) continue;

		/* Nuke it */
		term_nuke(angband_term[j]);
	}
}